

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O2

HighsInt Highs_getColsBySet(void *highs,HighsInt num_set_entries,HighsInt *set,HighsInt *num_col,
                           double *costs,double *lower,double *upper,HighsInt *num_nz,
                           HighsInt *matrix_start,HighsInt *matrix_index,double *matrix_value)

{
  HighsStatus HVar1;
  HighsInt local_num_nz;
  HighsInt local_num_col;
  HighsInt local_28;
  HighsInt local_24;
  
  HVar1 = Highs::getCols((Highs *)highs,num_set_entries,set,&local_24,costs,lower,upper,&local_28,
                         matrix_start,matrix_index,matrix_value);
  *num_col = local_24;
  *num_nz = local_28;
  return HVar1;
}

Assistant:

HighsInt Highs_getColsBySet(const void* highs, const HighsInt num_set_entries,
                            const HighsInt* set, HighsInt* num_col,
                            double* costs, double* lower, double* upper,
                            HighsInt* num_nz, HighsInt* matrix_start,
                            HighsInt* matrix_index, double* matrix_value) {
  HighsInt local_num_col, local_num_nz;
  HighsStatus status =
      ((Highs*)highs)
          ->getCols(num_set_entries, set, local_num_col, costs, lower, upper,
                    local_num_nz, matrix_start, matrix_index, matrix_value);
  *num_col = local_num_col;
  *num_nz = local_num_nz;
  return (HighsInt)status;
}